

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O2

int dp2(DdManager *dd,DdNode *f,st__table *t)

{
  int *piVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint *key;
  DdNode *f_00;
  
  if (f != (DdNode *)0x0) {
    key = (uint *)((ulong)f & 0xfffffffffffffffe);
    if (*key == 0x7fffffff) {
      fprintf((FILE *)dd->out,"ID = %c0x%lx\tvalue = %-9g\n",*(undefined8 *)(key + 4),
              (ulong)((uint)f & 1 | 0x20),(ulong)f / 0x28);
      return 1;
    }
    iVar3 = st__lookup(t,(char *)key,(char **)0x0);
    if (iVar3 == 1) {
      return 1;
    }
    iVar3 = st__add_direct(t,(char *)key,(char *)0x0);
    if (iVar3 == -10000) {
      return 0;
    }
    fprintf((FILE *)dd->out,"ID = %c0x%lx\tindex = %u\t",(ulong)((uint)f & 1 | 0x20),(ulong)f / 0x28
            ,(ulong)*key);
    piVar1 = *(int **)(key + 4);
    iVar3 = *piVar1;
    if (iVar3 == 0x7fffffff) {
      fprintf((FILE *)dd->out,"T = %-9g\t",*(undefined8 *)(piVar1 + 4));
    }
    else {
      fprintf((FILE *)dd->out,"T = 0x%lx\t",(ulong)piVar1 / 0x28);
    }
    uVar2 = *(ulong *)(key + 6);
    f_00 = (DdNode *)(uVar2 & 0xfffffffffffffffe);
    uVar5 = (ulong)((uint)uVar2 & 1 | 0x20);
    if (f_00->index == 0x7fffffff) {
      fprintf((FILE *)dd->out,"E = %c%-9g\n",(f_00->type).value,uVar5);
    }
    else {
      fprintf((FILE *)dd->out,"E = %c0x%lx\n",uVar5,uVar2 / 0x28);
      iVar4 = dp2(dd,f_00,t);
      if (iVar4 == 0) {
        return 0;
      }
    }
    if ((iVar3 == 0x7fffffff) || (iVar3 = dp2(dd,*(DdNode **)(key + 4),t), iVar3 != 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static int
dp2(
  DdManager *dd,
  DdNode * f,
  st__table * t)
{
    DdNode *g, *n, *N;
    int T,E;

    if (f == NULL) {
        return(0);
    }
    g = Cudd_Regular(f);
    if (cuddIsConstant(g)) {
#if SIZEOF_VOID_P == 8
        (void) fprintf(dd->out,"ID = %c0x%lx\tvalue = %-9g\n", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),cuddV(g));
#else
        (void) fprintf(dd->out,"ID = %c0x%x\tvalue = %-9g\n", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),cuddV(g));
#endif
        return(1);
    }
    if ( st__is_member(t,(char *) g) == 1) {
        return(1);
    }
    if ( st__add_direct(t,(char *) g,NULL) == st__OUT_OF_MEM)
        return(0);
#ifdef DD_STATS
#if SIZEOF_VOID_P == 8
    (void) fprintf(dd->out,"ID = %c0x%lx\tindex = %d\tr = %d\t", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode), g->index, g->ref);
#else
    (void) fprintf(dd->out,"ID = %c0x%x\tindex = %d\tr = %d\t", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),g->index,g->ref);
#endif
#else
#if SIZEOF_VOID_P == 8
    (void) fprintf(dd->out,"ID = %c0x%lx\tindex = %u\t", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),g->index);
#else
    (void) fprintf(dd->out,"ID = %c0x%x\tindex = %hu\t", bang(f),
                (ptruint) g / (ptruint) sizeof(DdNode),g->index);
#endif
#endif
    n = cuddT(g);
    if (cuddIsConstant(n)) {
        (void) fprintf(dd->out,"T = %-9g\t",cuddV(n));
        T = 1;
    } else {
#if SIZEOF_VOID_P == 8
        (void) fprintf(dd->out,"T = 0x%lx\t",(ptruint) n / (ptruint) sizeof(DdNode));
#else
        (void) fprintf(dd->out,"T = 0x%x\t",(ptruint) n / (ptruint) sizeof(DdNode));
#endif
        T = 0;
    }

    n = cuddE(g);
    N = Cudd_Regular(n);
    if (cuddIsConstant(N)) {
        (void) fprintf(dd->out,"E = %c%-9g\n",bang(n),cuddV(N));
        E = 1;
    } else {
#if SIZEOF_VOID_P == 8
        (void) fprintf(dd->out,"E = %c0x%lx\n", bang(n), (ptruint) N/(ptruint) sizeof(DdNode));
#else
        (void) fprintf(dd->out,"E = %c0x%x\n", bang(n), (ptruint) N/(ptruint) sizeof(DdNode));
#endif
        E = 0;
    }
    if (E == 0) {
        if (dp2(dd,N,t) == 0)
            return(0);
    }
    if (T == 0) {
        if (dp2(dd,cuddT(g),t) == 0)
            return(0);
    }
    return(1);

}